

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O1

void printByteCode(Code_attribute codeAttribute,cp_info *constantPool,uint8_t indentation)

{
  byte bVar1;
  u1 uVar2;
  u1 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  FILE *__stream;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  char *__format;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  
  if (codeAttribute.code_length != 0) {
    uVar12 = 1;
    uVar14 = 0;
    do {
      Utils::printTabs(out,indentation);
      uVar17 = uVar12 + 1;
      uVar16 = (ulong)uVar17;
      iVar26 = (int)uVar14;
      fprintf((FILE *)out,"%d\t%d\t%s",(ulong)uVar12,uVar14,instructions[codeAttribute.code[uVar14]]
             );
      __stream = out;
      bVar1 = codeAttribute.code[uVar14];
      if (((((byte)(bVar1 + 0x54) < 6) || ((byte)(bVar1 + 0x7b) < 0x14)) ||
          ((byte)(bVar1 - 0x3b) < 0x49)) || ((bVar1 < 0x10 || ((byte)(bVar1 - 0x1a) < 0x1c)))) {
LAB_0011094c:
        fputc(10,(FILE *)out);
        uVar14 = (ulong)(iVar26 + 1);
        uVar12 = uVar17;
        goto LAB_00110963;
      }
      if (0x35 < bVar1) {
        uVar11 = bVar1 - 0xa9;
        if (uVar11 < 0x1b) {
          if ((0x6600000U >> (uVar11 & 0x1f) & 1) != 0) goto LAB_0011094c;
          if (uVar11 == 0) goto switchD_0011091c_caseD_10;
          if (uVar11 == 0x13) {
            uVar14 = (ulong)codeAttribute.code[iVar26 + 1];
            pcVar19 = &DAT_001243b4 + *(int *)(&DAT_001243a4 + uVar14 * 4);
            __format = " %d (%s)\n";
            goto LAB_001109d9;
          }
        }
        if (bVar1 - 0x36 < 5) goto switchD_0011091c_caseD_10;
        if (bVar1 != 0x84) goto switchD_0011091c_default;
        uVar16 = (ulong)codeAttribute.code[iVar26 + 1];
        uVar14 = (ulong)codeAttribute.code[iVar26 + 2];
        pcVar19 = " %d by %d\n";
LAB_001108f6:
        fprintf((FILE *)out,pcVar19,uVar16,uVar14);
        goto LAB_00110a7b;
      }
      switch(bVar1) {
      case 0x10:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
switchD_0011091c_caseD_10:
        fprintf((FILE *)out," %d\n",(ulong)codeAttribute.code[iVar26 + 1]);
        break;
      case 0x11:
        fprintf((FILE *)out," %d\n",
                (ulong)((int)(short)((ushort)codeAttribute.code[iVar26 + 1] << 8) |
                       (uint)codeAttribute.code[iVar26 + 2]));
        goto LAB_00110a7b;
      case 0x12:
        bVar1 = codeAttribute.code[iVar26 + 1];
        pcVar19 = getFormattedConstant(constantPool,(ushort)bVar1);
        __format = " #%d <%s>\n";
        uVar14 = (ulong)bVar1;
LAB_001109d9:
        fprintf((FILE *)__stream,__format,uVar14,pcVar19);
        break;
      case 0x13:
      case 0x14:
switchD_0011091c_caseD_13:
        uVar2 = codeAttribute.code[iVar26 + 1];
        uVar3 = codeAttribute.code[iVar26 + 2];
        pcVar19 = getFormattedConstant(constantPool,CONCAT11(uVar2,uVar3));
        fprintf((FILE *)__stream," #%d <%s>\n",(ulong)CONCAT11(uVar2,uVar3),pcVar19);
LAB_00110a7b:
        uVar14 = (ulong)(iVar26 + 3);
        uVar12 = uVar17;
        goto LAB_00110963;
      default:
switchD_0011091c_default:
        if (((byte)(bVar1 + 0x4e) < 7) ||
           ((bVar1 - 0xbb < 7 && ((0x65U >> (bVar1 - 0xbb & 0x1f) & 1) != 0))))
        goto switchD_0011091c_caseD_13;
        if ((byte)(bVar1 + 0x67) < 0x10) {
switchD_00110ad6_caseD_c6:
          uVar12 = (int)(short)((ushort)codeAttribute.code[iVar26 + 1] << 8) |
                   (uint)codeAttribute.code[iVar26 + 2];
          uVar14 = (ulong)uVar12;
          uVar16 = (ulong)(uVar12 + iVar26);
          pcVar19 = " %d (%+d)\n";
          goto LAB_001108f6;
        }
        switch(bVar1) {
        case 0xb9:
          uVar2 = codeAttribute.code[iVar26 + 1];
          uVar3 = codeAttribute.code[iVar26 + 2];
          pcVar19 = getFormattedConstant(constantPool,CONCAT11(uVar2,uVar3));
          fprintf((FILE *)__stream," #%d <%s> count %d\n",(ulong)CONCAT11(uVar2,uVar3),pcVar19,
                  (ulong)codeAttribute.code[iVar26 + 3]);
          if (codeAttribute.code[iVar26 + 4] != '\0') {
            __assert_fail("code[i+4] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/classviewer.cpp"
                          ,0x1ea,"void printByteCode(Code_attribute, cp_info *, uint8_t)");
          }
          goto LAB_00110dfa;
        case 0xba:
        case 0xbb:
        case 0xbc:
        case 0xbd:
        case 0xbe:
        case 0xbf:
        case 0xc0:
        case 0xc1:
        case 0xc2:
        case 0xc3:
switchD_00110ad6_caseD_ba:
          fwrite("Invalid instruction opcode.\n",0x1c,1,(FILE *)out);
          exit(7);
        case 0xc4:
          uVar2 = codeAttribute.code[iVar26 + 2];
          uVar3 = codeAttribute.code[iVar26 + 3];
          fputc(10,(FILE *)out);
          Utils::printTabs(out,indentation);
          uVar14 = (ulong)(iVar26 + 1);
          fprintf((FILE *)out,"%d\t%d\t%s %d",uVar16,uVar14,instructions[codeAttribute.code[uVar14]]
                  ,(ulong)CONCAT11(uVar2,uVar3));
          uVar17 = iVar26 + 4;
          if (codeAttribute.code[uVar14] == 0x84) {
            fprintf((FILE *)out," by %d",
                    (ulong)((int)(short)((ushort)codeAttribute.code[uVar17] << 8) |
                           (uint)codeAttribute.code[iVar26 + 5]));
            uVar17 = iVar26 + 6;
          }
          uVar12 = uVar12 + 2;
          fputc(10,(FILE *)out);
          uVar14 = (ulong)uVar17;
          break;
        case 0xc5:
          uVar2 = codeAttribute.code[iVar26 + 1];
          uVar3 = codeAttribute.code[iVar26 + 2];
          pcVar19 = getFormattedConstant(constantPool,CONCAT11(uVar2,uVar3));
          fprintf((FILE *)__stream," #%d <%s> dim %d\n",(ulong)CONCAT11(uVar2,uVar3),pcVar19,
                  (ulong)codeAttribute.code[iVar26 + 3]);
          uVar14 = (ulong)(iVar26 + 4);
          uVar12 = uVar17;
          break;
        case 0xc6:
        case 199:
          goto switchD_00110ad6_caseD_c6;
        case 200:
        case 0xc9:
          fprintf((FILE *)out," %d (%+d)\n",
                  (ulong)(((uint)codeAttribute.code[iVar26 + 4] |
                          (uint)codeAttribute.code[iVar26 + 3] << 8 |
                          (uint)codeAttribute.code[iVar26 + 2] << 0x10 |
                          (uint)codeAttribute.code[iVar26 + 1] << 0x18) + iVar26));
LAB_00110dfa:
          uVar14 = (ulong)(iVar26 + 5);
          uVar12 = uVar17;
          break;
        default:
          if (bVar1 == 0xaa) {
            uVar11 = iVar26 + 1U & 3;
            bVar1 = codeAttribute.code[uVar11 + iVar26 + 1];
            bVar4 = codeAttribute.code[uVar11 + 2 + iVar26];
            bVar5 = codeAttribute.code[uVar11 + 3 + iVar26];
            bVar6 = codeAttribute.code[uVar11 + 4 + iVar26];
            uVar12 = (uint)codeAttribute.code[uVar11 + iVar26 + 8] |
                     (uint)codeAttribute.code[uVar11 + iVar26 + 7] << 8 |
                     (uint)codeAttribute.code[uVar11 + iVar26 + 6] << 0x10 |
                     (uint)codeAttribute.code[uVar11 + iVar26 + 5] << 0x18;
            uVar27 = (uint)codeAttribute.code[uVar11 + iVar26 + 0xc] |
                     (uint)codeAttribute.code[uVar11 + iVar26 + 0xb] << 8 |
                     (uint)codeAttribute.code[uVar11 + iVar26 + 10] << 0x10 |
                     (uint)codeAttribute.code[uVar11 + iVar26 + 9] << 0x18;
            fprintf((FILE *)out," %d to %d\n",(ulong)uVar12,(ulong)uVar27);
            iVar24 = uVar27 - uVar12;
            if (iVar24 == -1) {
              iVar13 = uVar11 + 0xd;
            }
            else {
              iVar15 = iVar26 + 0x10;
              iVar18 = iVar26 + 0xf;
              iVar20 = iVar26 + 0xe;
              iVar21 = iVar26 + 0xd;
              uVar27 = 0;
              iVar13 = 0xd;
              do {
                uVar28 = (uint)codeAttribute.code[uVar11 + iVar15] |
                         (uint)codeAttribute.code[uVar11 + iVar18] << 8 |
                         (uint)codeAttribute.code[uVar11 + iVar20] << 0x10 |
                         (uint)codeAttribute.code[uVar11 + iVar21] << 0x18;
                Utils::printTabs(out,indentation);
                fprintf((FILE *)out,"%d\t\t\t%d: %d (%+d)\n",uVar17 + uVar27,uVar12 + uVar27,
                        (ulong)(uVar28 + iVar26),(ulong)uVar28);
                uVar27 = uVar27 + 1;
                iVar15 = iVar15 + 4;
                iVar18 = iVar18 + 4;
                iVar20 = iVar20 + 4;
                iVar21 = iVar21 + 4;
                iVar13 = iVar13 + 4;
              } while (uVar27 < iVar24 + 1U);
              uVar17 = uVar17 + uVar27;
              iVar13 = uVar11 + iVar13;
            }
            Utils::printTabs(out,indentation);
            fprintf((FILE *)out,"%d\t\t\tdefault: %d (%+d)\n",(ulong)uVar17,
                    (ulong)(((uint)bVar5 << 8 | (uint)bVar4 << 0x10 | (uint)bVar1 << 0x18) +
                            (uint)bVar6 + iVar26));
            uVar14 = (ulong)(uint)(iVar13 + iVar26);
            uVar12 = uVar17 + 1;
          }
          else {
            if (bVar1 != 0xab) goto switchD_00110ad6_caseD_ba;
            uVar12 = iVar26 + 1U & 3;
            bVar1 = codeAttribute.code[uVar12 + iVar26 + 1];
            bVar4 = codeAttribute.code[uVar12 + 2 + iVar26];
            bVar5 = codeAttribute.code[uVar12 + 3 + iVar26];
            bVar6 = codeAttribute.code[uVar12 + 4 + iVar26];
            uVar17 = (uint)codeAttribute.code[uVar12 + iVar26 + 7] << 8 |
                     (uint)codeAttribute.code[uVar12 + iVar26 + 6] << 0x10 |
                     (uint)codeAttribute.code[uVar12 + iVar26 + 5] << 0x18;
            bVar7 = codeAttribute.code[uVar12 + iVar26 + 8];
            fprintf((FILE *)out," %d\n",(ulong)(uVar17 | bVar7));
            uVar17 = uVar17 | bVar7;
            if (uVar17 == 0) {
              iVar24 = uVar12 + 9;
            }
            else {
              iVar15 = iVar26 + 0x10;
              iVar18 = iVar26 + 0xf;
              iVar20 = iVar26 + 0xe;
              iVar21 = iVar26 + 0xd;
              iVar22 = iVar26 + 0xc;
              iVar23 = iVar26 + 0xb;
              iVar13 = iVar26 + 10;
              iVar25 = iVar26 + 9;
              iVar24 = -9;
              uVar14 = uVar16;
              do {
                bVar7 = codeAttribute.code[uVar12 + iVar25];
                bVar8 = codeAttribute.code[iVar13 + uVar12];
                bVar9 = codeAttribute.code[uVar12 + iVar23];
                bVar10 = codeAttribute.code[uVar12 + iVar22];
                uVar11 = (uint)codeAttribute.code[uVar12 + iVar15] |
                         (uint)codeAttribute.code[uVar12 + iVar18] << 8 |
                         (uint)codeAttribute.code[uVar12 + iVar20] << 0x10 |
                         (uint)codeAttribute.code[uVar12 + iVar21] << 0x18;
                Utils::printTabs(out,indentation);
                uVar16 = (ulong)((int)uVar14 + 1);
                fprintf((FILE *)out,"%d\t\t\t%d: %d (%+d)\n",uVar14,
                        (ulong)((uint)bVar10 |
                               (uint)bVar9 << 8 | (uint)bVar8 << 0x10 | (uint)bVar7 << 0x18),
                        (ulong)(uVar11 + iVar26),(ulong)uVar11);
                iVar15 = iVar15 + 8;
                iVar18 = iVar18 + 8;
                iVar20 = iVar20 + 8;
                iVar21 = iVar21 + 8;
                iVar22 = iVar22 + 8;
                iVar23 = iVar23 + 8;
                iVar13 = iVar13 + 8;
                iVar25 = iVar25 + 8;
                iVar24 = iVar24 + -8;
                uVar17 = uVar17 - 1;
                uVar14 = uVar16;
              } while (uVar17 != 0);
              iVar24 = uVar12 - iVar24;
            }
            uVar12 = ((uint)bVar5 << 8 | (uint)bVar4 << 0x10 | (uint)bVar1 << 0x18) + (uint)bVar6;
            Utils::printTabs(out,indentation);
            fprintf((FILE *)out,"%d\t\t\tdefault: %d (%+d)\n",uVar16,(ulong)(uVar12 + iVar26),
                    (ulong)uVar12);
            uVar14 = (ulong)(uint)(iVar24 + iVar26);
            uVar12 = (int)uVar16 + 1;
          }
        }
        goto LAB_00110963;
      }
      uVar14 = (ulong)(iVar26 + 2);
      uVar12 = uVar17;
LAB_00110963:
    } while ((uint)uVar14 < codeAttribute.code_length);
  }
  return;
}

Assistant:

void printByteCode(Code_attribute codeAttribute, cp_info *constantPool, uint8_t indentation) {
    u4 code_length = codeAttribute.code_length;
    u1 *code = codeAttribute.code;
    
    uint32_t lineNumber = 1;
    u4 i = 0;
    while (i < code_length) {
        Utils::printTabs(out, indentation);
        fprintf(out,"%d\t%d\t%s", lineNumber++, i, instructions[code[i]]);
        
        if (code[i] <= 0x0f || (code[i] >= 0x1a && code[i] <= 0x35) || (code[i] >= 0x3b && code[i] <= 0x83) || (code[i] >= 0x85 && code[i] <= 0x98) ||
            (code[i] >= 0xac && code[i] <= 0xb1) || code[i] == 0xbe || code[i] == 0xbf || code[i] == 0xc2 || code[i] == 0xc3) {
            fprintf(out,"\n");
            i += 1;
        } else if (code[i] == 0x12) { // usa CP
            fprintf(out," #%d <%s>\n", code[i+1], getFormattedConstant(constantPool, code[i+1]));
            i += 2;
        } else if (code[i] == 0xbc) { // newarray
            u1 atype = code[i+1];
            const char* types[] = {"boolean", "char", "float", "double", "byte", "short", "int", "long"};
            fprintf(out," %d (%s)\n", atype, types[atype-4]);
            i += 2;
        } else if (code[i] == 0x10 || (code[i] >= 0x15 && code[i] <= 0x19) || (code[i] >= 0x36 && code[i] <= 0x3a) || code[i] == 0xa9) {
            fprintf(out," %d\n", code[i+1]);
            i += 2;
        } else if (code[i] == 0x11) { // sipush
            int16_t number = (code[i+1] << 8) | code[i+2];
            fprintf(out," %d\n", number);
            i += 3;
        } else if (code[i] == 0x84) { // iinc
            fprintf(out," %d by %d\n", code[i+1], code[i+2]);
            i += 3;
        } else if (code[i] == 0x13 || code[i] == 0x14 || (code[i] >= 0xb2 && code[i] <= 0xb8) ||
                   code[i] == 0xbb || code[i] == 0xbd || code[i] == 0xc0 || code[i] == 0xc1) { // usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s>\n", number, getFormattedConstant(constantPool, number));
            i += 3;
        } else if ((code[i] >= 0x99 && code[i] <= 0xa8) || code[i] == 0xc6 || code[i] == 0xc7) {
            int16_t number = (code[i+1] << 8) | code[i+2];
            fprintf(out," %d (%+d)\n", i+number, number);
            i += 3;
        } else if (code[i] == 0xc5) { // multianewarray - usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s> dim %d\n", number, getFormattedConstant(constantPool, number), code[i+3]);
            i += 4;
        } else if (code[i] == 0xb9) { // invokeinterface - usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s> count %d\n", number, getFormattedConstant(constantPool, number), code[i+3]);
            assert(code[i+4] == 0);
            i += 5;
        } else if (code[i] == 0xc8 || code[i] == 0xc9) { // goto_w e jsr_w
            int32_t number = (code[i+1] << 24) | (code[i+2] << 16) | (code[i+3] << 8) | code[i+4];
            fprintf(out," %d (%+d)\n", i+number, number);
            i += 5;
        } else if (code[i] == 0xc4) { // wide
            u2 indexbyte = (code[i+2] << 8) | code[i+3];
            
            fprintf(out,"\n");
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t%d\t%s %d", lineNumber++, i+1, instructions[code[i+1]], indexbyte);
            
            if (code[i+1] == 0x84) { // format 2 (iinc)
                int16_t constbyte = (code[i+4] << 8) | code[i+5];
                fprintf(out," by %d", constbyte);
                i += 6;
            } else {
                i += 4;
            }
            
            fprintf(out,"\n");
        } else if (code[i] == 0xaa) { // tableswitch
            u1 padding = (i+1) % 4;
            int32_t defaultbytes = (code[padding+i+1] << 24) | (code[padding+i+2] << 16) | (code[padding+i+3] << 8) | code[padding+i+4];
            int32_t lowbytes = (code[padding+i+5] << 24) | (code[padding+i+6] << 16) | (code[padding+i+7] << 8) | code[padding+i+8];
            int32_t highbytes = (code[padding+i+9] << 24) | (code[padding+i+10] << 16) | (code[padding+i+11] << 8) | code[padding+i+12];
            
            fprintf(out," %d to %d\n", lowbytes, highbytes);
            
            u4 howManyBytes = 1 + padding + 12; // 1 (instruction) + padding + 12 (the 12 bytes above)
            int32_t offsets = highbytes - lowbytes + 1;
            
            for (u4 n = 0; n < offsets; n++) {
                int32_t offset = (code[i+howManyBytes] << 24) | (code[i+howManyBytes+1] << 16) | (code[i+howManyBytes+2] << 8) | code[i+howManyBytes+3];
                Utils::printTabs(out, indentation);
                fprintf(out,"%d\t\t\t%d: %d (%+d)\n", lineNumber++, lowbytes, i + offset, offset);
                
                lowbytes++;
                howManyBytes += 4;
            }
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t\t\tdefault: %d (%+d)\n", lineNumber++, i + defaultbytes, defaultbytes);
            
            i += howManyBytes;
        } else if (code[i] == 0xab) { // lookupswitch
            u1 padding = (i+1) % 4;
            int32_t defaultbytes = (code[padding+i+1] << 24) | (code[padding+i+2] << 16) | (code[padding+i+3] << 8) | code[padding+i+4];
            int32_t npairs = (code[padding+i+5] << 24) | (code[padding+i+6] << 16) | (code[padding+i+7] << 8) | code[padding+i+8];
            
            u4 howManyBytes = 1 + padding + 8; // 1 (instruction) + padding + 8 (the 8 bytes above)
            
            fprintf(out," %d\n", npairs);
            
            for (u4 n = 0; n < npairs; n++) {
                int32_t match = (code[i+howManyBytes] << 24) | (code[i+howManyBytes+1] << 16) | (code[i+howManyBytes+2] << 8) | code[i+howManyBytes+3];
                int32_t offset = (code[i+howManyBytes+4] << 24) | (code[i+howManyBytes+5] << 16) | (code[i+howManyBytes+6] << 8) | code[i+howManyBytes+7];
                Utils::printTabs(out, indentation);
                fprintf(out,"%d\t\t\t%d: %d (%+d)\n", lineNumber++, match, i + offset, offset);
                howManyBytes += 8;
            }
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t\t\tdefault: %d (%+d)\n", lineNumber++, i + defaultbytes, defaultbytes);
            
            i += howManyBytes;
        } else {
            fprintf(out,"Invalid instruction opcode.\n");
            exit(7);
        }
    }
}